

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O1

void D4C(double *x,int x_length,int fs,double *temporal_positions,double *f0,int f0_length,
        int fft_size,D4COption *option,double **aperiodicity)

{
  ulong uVar1;
  int y_length;
  undefined1 auVar2 [16];
  double dVar3;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  int i;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  double *y;
  void *pvVar8;
  void *__s;
  double *pdVar9;
  double *x_00;
  double *xi;
  ulong uVar10;
  double *pdVar11;
  double *input;
  double *input_00;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  double *pdVar15;
  double *pdVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  fft_plan *pfVar25;
  uint fft_size_00;
  ulong uVar26;
  undefined8 *puVar27;
  ulong uVar28;
  uint uVar29;
  byte bVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double *pdVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  RandnState randn_state;
  ForwardRealFFT forward_real_fft;
  ForwardRealFFT forward_real_fft_1;
  undefined1 in_stack_fffffffffffffdb0 [32];
  uint fft_size_01;
  undefined4 in_stack_fffffffffffffde8;
  double dStack_200;
  RandnState local_138;
  ulong local_120;
  long local_118;
  double local_110;
  undefined1 local_108 [16];
  ForwardRealFFT local_f8;
  ForwardRealFFT local_98;
  
  bVar30 = 0;
  local_138.g_randn_x = 0;
  local_138.g_randn_y = 0;
  local_138.g_randn_z = 0;
  local_138.g_randn_w = 0;
  randn_reseed(&local_138);
  uVar28 = (ulong)(uint)f0_length;
  if (0 < f0_length) {
    uVar18 = 0;
    do {
      if (-2 < fft_size) {
        pdVar33 = aperiodicity[uVar18];
        uVar26 = 0;
        do {
          pdVar33[uVar26] = 0.999999999999;
          uVar26 = uVar26 + 1;
        } while (fft_size / 2 + 1 != uVar26);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar28);
  }
  pdVar33 = (double *)(double)fs;
  dVar3 = log(((double)pdVar33 * 4.0) / 47.0 + 1.0);
  dVar3 = exp2((double)(int)(dVar3 / 0.6931471805599453) + 1.0);
  auVar2._8_4_ = extraout_XMM0_Dc;
  auVar2._0_8_ = dVar3;
  auVar2._12_4_ = extraout_XMM0_Dd;
  fft_size_00 = (uint)dVar3;
  local_f8.forward_fft.ip = (int *)0x0;
  local_f8.forward_fft.w = (double *)0x0;
  local_f8.forward_fft.out = (double *)0x0;
  local_f8.forward_fft.input = (double *)0x0;
  local_f8.forward_fft.in = (double *)0x0;
  local_f8.forward_fft.c_out = (fft_complex *)0x0;
  local_f8.forward_fft.flags = 0;
  local_f8.forward_fft._12_4_ = 0;
  local_f8.forward_fft.c_in = (fft_complex *)0x0;
  local_f8.spectrum = (fft_complex *)0x0;
  local_f8.forward_fft.n = 0;
  local_f8.forward_fft.sign = 0;
  local_f8.fft_size = 0;
  local_f8._4_4_ = 0;
  local_f8.waveform = (double *)0x0;
  InitializeForwardRealFFT(fft_size_00,&local_f8);
  dStack_200 = auVar2._8_8_;
  local_108._8_4_ = SUB84((double)(int)dStack_200,0);
  local_108._0_8_ = (double)(int)dVar3;
  local_108._12_4_ = (int)((ulong)(double)(int)dStack_200 >> 0x20);
  iVar4 = (int)(((double)(int)dVar3 * 3000.0) / (double)pdVar33);
  y_length = iVar4 * 2 + 1;
  uVar18 = (long)y_length * 8;
  if (iVar4 < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  y = (double *)operator_new__(uVar18);
  NuttallWindow(y_length,y);
  uVar18 = (long)f0_length << 3;
  if (f0_length < 0) {
    uVar18 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar18);
  dVar3 = log(((double)pdVar33 * 3.0) / 40.0 + 1.0);
  dVar3 = exp2((double)(int)(dVar3 / 0.6931471805599453) + 1.0);
  iVar4 = (int)dVar3;
  local_98.forward_fft.ip = (int *)0x0;
  local_98.forward_fft.w = (double *)0x0;
  local_98.forward_fft.out = (double *)0x0;
  local_98.forward_fft.input = (double *)0x0;
  local_98.forward_fft.in = (double *)0x0;
  local_98.forward_fft.c_out = (fft_complex *)0x0;
  local_98.forward_fft.flags = 0;
  local_98.forward_fft._12_4_ = 0;
  local_98.forward_fft.c_in = (fft_complex *)0x0;
  local_98.spectrum = (fft_complex *)0x0;
  local_98.forward_fft.n = 0;
  local_98.forward_fft.sign = 0;
  local_98.fft_size = 0;
  local_98._4_4_ = 0;
  local_98.waveform = (double *)0x0;
  InitializeForwardRealFFT(iVar4,&local_98);
  dVar34 = (double)pdVar33 * 0.5;
  dVar3 = dVar34 + -3000.0;
  dVar35 = 15000.0;
  if (dVar3 <= 15000.0) {
    dVar35 = dVar3;
  }
  uVar5 = (uint)(dVar35 / 3000.0);
  if (0 < f0_length) {
    dVar35 = (double)iVar4;
    dVar3 = ceil((dVar35 * 7900.0) / (double)pdVar33);
    iVar24 = (int)dVar3;
    dVar3 = ceil((dVar35 * 4000.0) / (double)pdVar33);
    dVar35 = ceil((dVar35 * 100.0) / (double)pdVar33);
    uVar22 = (uint)dVar35;
    uVar18 = (long)iVar4 << 3;
    if (iVar4 < 0) {
      uVar18 = 0xffffffffffffffff;
    }
    dVar35 = (double)pdVar33 * 1.5;
    lVar23 = (long)(int)uVar22;
    lVar19 = (long)(int)dVar3;
    uVar26 = 0;
    do {
      dVar3 = f0[uVar26];
      uVar31 = SUB84(dVar3,0);
      uVar32 = (undefined4)((ulong)dVar3 >> 0x20);
      dVar36 = 0.0;
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        if (dVar3 <= 40.0) {
          uVar31 = 0;
          uVar32 = 0x40440000;
        }
        dVar36 = (double)CONCAT44(uVar32,uVar31);
        dVar3 = temporal_positions[uVar26];
        __s = operator_new__(uVar18);
        iVar6 = matlab_round(dVar35 / dVar36);
        anon_unknown.dwarf_7f6f::GetWindowedWaveform
                  (x,x_length,fs,dVar36,dVar3,2,3.0,local_98.waveform,&local_138);
        if (iVar6 * 2 + 1 < iVar4) {
          memset(local_98.waveform + (long)(iVar6 * 2) + 1,0,
                 (ulong)(uint)(iVar4 + -2 + iVar6 * -2) * 8 + 8);
        }
        pfVar25 = &local_98.forward_fft;
        puVar27 = (undefined8 *)&stack0xfffffffffffffd88;
        for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar27 = *(undefined8 *)pfVar25;
          pfVar25 = (fft_plan *)((long)pfVar25 + ((ulong)bVar30 * -2 + 1) * 8);
          puVar27 = puVar27 + (ulong)bVar30 * -2 + 1;
        }
        p.c_out._0_4_ = fft_size_00;
        p.n = in_stack_fffffffffffffdb0._0_4_;
        p.sign = in_stack_fffffffffffffdb0._4_4_;
        p.flags = in_stack_fffffffffffffdb0._8_4_;
        p._12_4_ = in_stack_fffffffffffffdb0._12_4_;
        p.c_in = (fft_complex *)in_stack_fffffffffffffdb0._16_8_;
        p.in = (double *)in_stack_fffffffffffffdb0._24_8_;
        p.c_out._4_4_ = fs;
        p.out = (double *)lVar19;
        p.input = (double *)dVar36;
        p.ip._0_4_ = in_stack_fffffffffffffde8;
        p.ip._4_4_ = x_length;
        p.w = pdVar33;
        fft_execute(p);
        if (-1 < (int)uVar22) {
          memset(__s,0,(ulong)uVar22 * 8 + 8);
        }
        if ((int)uVar22 < iVar4 / 2) {
          pdVar9 = local_98.spectrum[lVar23 + 1] + 1;
          lVar20 = lVar23;
          do {
            *(double *)((long)__s + lVar20 * 8 + 8) =
                 (*(fft_complex *)(pdVar9 + -1))[0] * (*(fft_complex *)(pdVar9 + -1))[0] +
                 *pdVar9 * *pdVar9;
            lVar20 = lVar20 + 1;
            pdVar9 = pdVar9 + 2;
          } while (iVar4 / 2 != lVar20);
        }
        if ((int)uVar22 <= iVar24) {
          dVar3 = *(double *)((long)__s + lVar23 * 8 + -8);
          lVar20 = 0;
          do {
            dVar3 = dVar3 + *(double *)((long)__s + lVar20 * 8 + lVar23 * 8);
            *(double *)((long)__s + lVar20 * 8 + lVar23 * 8) = dVar3;
            lVar20 = lVar20 + 1;
          } while ((iVar24 - uVar22) + 1 != (int)lVar20);
        }
        dVar36 = *(double *)((long)__s + lVar19 * 8) / *(double *)((long)__s + (long)iVar24 * 8);
        operator_delete__(__s);
      }
      *(double *)((long)pvVar8 + uVar26 * 8) = dVar36;
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar28);
  }
  DestroyForwardRealFFT(&local_98);
  lVar19 = (long)(int)uVar5;
  uVar18 = lVar19 * 8 + 0x10;
  if ((int)uVar5 < -2) {
    uVar18 = 0xffffffffffffffff;
  }
  pdVar9 = (double *)operator_new__(uVar18);
  *pdVar9 = -60.0;
  pdVar9[lVar19 + 1] = -1e-12;
  x_00 = (double *)operator_new__(uVar18);
  if (-1 < (int)uVar5) {
    uVar18 = 0;
    do {
      x_00[uVar18] = (double)(int)uVar18 * 3000.0;
      uVar18 = uVar18 + 1;
    } while (uVar5 + 1 != uVar18);
  }
  x_00[lVar19 + 1] = dVar34;
  uVar22 = fft_size / 2 + 1;
  uVar18 = 0xffffffffffffffff;
  if (-4 < fft_size) {
    uVar18 = (long)(fft_size / 2) * 8 + 8;
  }
  xi = (double *)operator_new__(uVar18);
  if (-2 < fft_size) {
    uVar18 = 0;
    do {
      xi[uVar18] = ((double)(int)uVar18 * (double)pdVar33) / (double)fft_size;
      uVar18 = uVar18 + 1;
    } while (uVar22 != uVar18);
  }
  if (0 < f0_length) {
    uVar26 = (ulong)((int)fft_size_00 / 2 + 1);
    local_118 = (long)((int)fft_size_00 / 2);
    local_120 = local_118 * 8 + 8;
    uVar18 = 0xffffffffffffffff;
    if (-4 < (int)fft_size_00) {
      uVar18 = local_120;
    }
    uVar10 = (ulong)fft_size_00;
    local_110 = ((double)local_108._0_8_ * 8.0) / (double)y_length;
    uVar17 = 0;
    uVar29 = y_length - (y_length >> 0x1f) & 0xfffffffe;
    if ((int)uVar29 < 1) {
      uVar29 = 0;
    }
    do {
      dVar3 = f0[uVar17];
      if (((dVar3 != 0.0) || (NAN(dVar3))) &&
         (option->threshold < *(double *)((long)pvVar8 + uVar17 * 8))) {
        dVar35 = 47.0;
        if (47.0 <= dVar3) {
          dVar35 = dVar3;
        }
        dVar3 = temporal_positions[uVar17];
        pdVar11 = (double *)operator_new__(uVar18);
        input = (double *)operator_new__(uVar18);
        input_00 = (double *)operator_new__(uVar18);
        pdVar12 = (double *)operator_new__(uVar18);
        pdVar13 = (double *)operator_new__(uVar18);
        dVar34 = 0.25 / dVar35;
        iVar4 = fs;
        anon_unknown.dwarf_7f6f::GetCentroid
                  (x,x_length,fs,dVar35,fft_size_00,dVar3 - dVar34,&local_f8,pdVar12,&local_138);
        uVar7 = fft_size_00;
        anon_unknown.dwarf_7f6f::GetCentroid
                  (x,x_length,fs,dVar35,fft_size_00,dVar34 + dVar3,&local_f8,pdVar13,&local_138);
        if (-2 < (int)fft_size_00) {
          uVar14 = 0;
          do {
            pdVar11[uVar14] = pdVar12[uVar14] + pdVar13[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar26 != uVar14);
        }
        DCCorrection(pdVar11,dVar35,iVar4,fft_size_00,pdVar11);
        operator_delete__(pdVar12);
        operator_delete__(pdVar13);
        pdVar12 = pdVar9;
        if (0 < (int)fft_size_00) {
          memset(local_f8.waveform,0,uVar10 << 3);
          pdVar12 = pdVar9;
        }
        fs = iVar4;
        anon_unknown.dwarf_7f6f::GetWindowedWaveform
                  (x,x_length,iVar4,dVar35,dVar3,1,4.0,local_f8.waveform,&local_138);
        pfVar25 = &local_f8.forward_fft;
        puVar27 = (undefined8 *)&stack0xfffffffffffffd88;
        for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
          *puVar27 = *(undefined8 *)pfVar25;
          pfVar25 = (fft_plan *)((long)pfVar25 + ((ulong)bVar30 * -2 + 1) * 8);
          puVar27 = puVar27 + (ulong)bVar30 * -2 + 1;
        }
        p_00.c_out._0_4_ = uVar7;
        p_00.n = in_stack_fffffffffffffdb0._0_4_;
        p_00.sign = in_stack_fffffffffffffdb0._4_4_;
        p_00.flags = in_stack_fffffffffffffdb0._8_4_;
        p_00._12_4_ = in_stack_fffffffffffffdb0._12_4_;
        p_00.c_in = (fft_complex *)in_stack_fffffffffffffdb0._16_8_;
        p_00.in = (double *)in_stack_fffffffffffffdb0._24_8_;
        p_00.c_out._4_4_ = fs;
        p_00.out = (double *)dVar35;
        p_00.input = pdVar12;
        p_00.ip._0_4_ = in_stack_fffffffffffffde8;
        p_00.ip._4_4_ = x_length;
        p_00.w = pdVar33;
        fft_execute(p_00);
        if ((int)uVar7 < -1) {
          DCCorrection(input,dVar35,iVar4,uVar7,input);
          LinearSmoothing(input,dVar35,iVar4,uVar7,input);
          fft_size_01 = uVar7;
        }
        else {
          pdVar9 = *local_f8.spectrum + 1;
          uVar14 = 0;
          do {
            input[uVar14] =
                 (*(fft_complex *)(pdVar9 + -1))[0] * (*(fft_complex *)(pdVar9 + -1))[0] +
                 *pdVar9 * *pdVar9;
            uVar14 = uVar14 + 1;
            pdVar9 = pdVar9 + 2;
          } while (uVar26 != uVar14);
          fft_size_01 = uVar7;
          DCCorrection(input,dVar35,fs,uVar7,input);
          LinearSmoothing(input,dVar35,fs,uVar7,input);
          uVar14 = 0;
          do {
            input_00[uVar14] = pdVar11[uVar14] / input[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar26 != uVar14);
        }
        fft_size_00 = fft_size_01;
        LinearSmoothing(input_00,dVar35 * 0.5,fs,fft_size_01,input_00);
        pdVar9 = (double *)operator_new__(uVar18);
        LinearSmoothing(input_00,dVar35,fs,fft_size_01,pdVar9);
        if (-2 < (int)fft_size_01) {
          uVar14 = 0;
          do {
            input_00[uVar14] = input_00[uVar14] - pdVar9[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar26 != uVar14);
        }
        operator_delete__(pdVar9);
        uVar7 = matlab_round(local_110);
        if (0 < (int)fft_size_00) {
          memset(local_f8.waveform,0,uVar10 << 3);
        }
        pdVar9 = (double *)operator_new__(uVar18);
        if ((int)uVar5 < 1) {
          operator_delete__(pdVar9);
        }
        else {
          pdVar13 = pdVar9 + local_118;
          pdVar15 = pdVar9 + local_118 + 1;
          lVar19 = 0x3f;
          if ((long)local_120 >> 3 != 0) {
            for (; (ulong)((long)local_120 >> 3) >> lVar19 == 0; lVar19 = lVar19 + -1) {
            }
          }
          iVar4 = (int)local_118;
          uVar14 = 0;
          do {
            uVar1 = uVar14 + 1;
            if (-2 < y_length) {
              lVar23 = 0;
              do {
                local_f8.waveform[lVar23] =
                     input_00[((int)(((double)(int)uVar1 * 3000.0 * (double)local_108._0_8_) /
                                    (double)pdVar33) - y_length / 2) + lVar23] * y[lVar23];
                lVar23 = lVar23 + 1;
              } while ((ulong)uVar29 + 1 != lVar23);
            }
            pfVar25 = &local_f8.forward_fft;
            puVar27 = (undefined8 *)&stack0xfffffffffffffd88;
            for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
              *puVar27 = *(undefined8 *)pfVar25;
              pfVar25 = (fft_plan *)((long)pfVar25 + ((ulong)bVar30 * -2 + 1) * 8);
              puVar27 = puVar27 + (ulong)bVar30 * -2 + 1;
            }
            p_01.c_out._0_4_ = fft_size_00;
            p_01.n = in_stack_fffffffffffffdb0._0_4_;
            p_01.sign = in_stack_fffffffffffffdb0._4_4_;
            p_01.flags = in_stack_fffffffffffffdb0._8_4_;
            p_01._12_4_ = in_stack_fffffffffffffdb0._12_4_;
            p_01.c_in = (fft_complex *)in_stack_fffffffffffffdb0._16_8_;
            p_01.in = (double *)in_stack_fffffffffffffdb0._24_8_;
            p_01.c_out._4_4_ = fs;
            p_01.out = (double *)dVar35;
            p_01.input = pdVar12;
            p_01.ip._0_4_ = in_stack_fffffffffffffde8;
            p_01.ip._4_4_ = x_length;
            p_01.w = pdVar33;
            fft_execute(p_01);
            if (-2 < (int)fft_size_00) {
              pdVar16 = *local_f8.spectrum + 1;
              uVar21 = 0;
              do {
                pdVar9[uVar21] =
                     (*(fft_complex *)(pdVar16 + -1))[0] * (*(fft_complex *)(pdVar16 + -1))[0] +
                     *pdVar16 * *pdVar16;
                uVar21 = uVar21 + 1;
                pdVar16 = pdVar16 + 2;
              } while (uVar26 != uVar21);
            }
            if (pdVar9 != pdVar15) {
              std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (pdVar9,pdVar15,((uint)lVar19 ^ 0x3f) * 2 ^ 0x7e);
              std::__final_insertion_sort<double*,__gnu_cxx::__ops::_Iter_less_iter>(pdVar9,pdVar15)
              ;
            }
            if (1 < (int)fft_size_00) {
              dVar3 = *pdVar9;
              uVar21 = 1;
              do {
                dVar3 = dVar3 + pdVar9[uVar21];
                pdVar9[uVar21] = dVar3;
                uVar21 = uVar21 + 1;
              } while (uVar26 != uVar21);
            }
            dVar3 = log10(pdVar9[(int)(~uVar7 + iVar4)] / *pdVar13);
            pdVar12[uVar14 + 1] = dVar3 * 10.0;
            uVar14 = uVar1;
          } while (uVar1 != uVar5);
          operator_delete__(pdVar9);
          if (0 < (int)uVar5) {
            uVar14 = 0;
            do {
              dVar3 = pdVar12[uVar14 + 1] + (dVar35 + -100.0) / 50.0;
              dVar34 = 0.0;
              if (dVar3 <= 0.0) {
                dVar34 = dVar3;
              }
              pdVar12[uVar14 + 1] = dVar34;
              uVar14 = uVar14 + 1;
            } while (uVar5 != uVar14);
          }
        }
        pdVar9 = pdVar12;
        operator_delete__(pdVar11);
        operator_delete__(input);
        operator_delete__(input_00);
        pdVar11 = aperiodicity[uVar17];
        interp1(x_00,pdVar12,uVar5 + 2,xi,uVar22,pdVar11);
        if (-2 < fft_size) {
          uVar14 = 0;
          do {
            dVar3 = pow(10.0,pdVar11[uVar14] / 20.0);
            pdVar11[uVar14] = dVar3;
            uVar14 = uVar14 + 1;
          } while (uVar22 != uVar14);
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar28);
  }
  DestroyForwardRealFFT(&local_f8);
  operator_delete__(pvVar8);
  operator_delete__(x_00);
  operator_delete__(pdVar9);
  operator_delete__(y);
  operator_delete__(xi);
  return;
}

Assistant:

void D4C(const double *x, int x_length, int fs,
    const double *temporal_positions, const double *f0, int f0_length,
    int fft_size, const D4COption *option, double **aperiodicity) {
  RandnState randn_state = {};
  randn_reseed(&randn_state);

  InitializeAperiodicity(f0_length, fft_size, aperiodicity);

  int fft_size_d4c = static_cast<int>(pow(2.0, 1.0 +
    static_cast<int>(log(4.0 * fs / world::kFloorF0D4C + 1) /
      world::kLog2)));

  ForwardRealFFT forward_real_fft = {0};
  InitializeForwardRealFFT(fft_size_d4c, &forward_real_fft);

  int number_of_aperiodicities =
    static_cast<int>(MyMinDouble(world::kUpperLimit, fs / 2.0 -
      world::kFrequencyInterval) / world::kFrequencyInterval);
  // Since the window function is common in D4CGeneralBody(),
  // it is designed here to speed up.
  int window_length =
    static_cast<int>(world::kFrequencyInterval * fft_size_d4c / fs) * 2 + 1;
  double *window =  new double[window_length];
  NuttallWindow(window_length, window);

  // D4C Love Train (Aperiodicity of 0 Hz is given by the different algorithm)
  double *aperiodicity0 = new double[f0_length];
  D4CLoveTrain(x, fs, x_length, f0, f0_length, temporal_positions,
      aperiodicity0, &randn_state);

  double *coarse_aperiodicity = new double[number_of_aperiodicities + 2];
  coarse_aperiodicity[0] = -60.0;
  coarse_aperiodicity[number_of_aperiodicities + 1] =
    -world::kMySafeGuardMinimum;
  double *coarse_frequency_axis = new double[number_of_aperiodicities + 2];
  for (int i = 0; i <= number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = i * world::kFrequencyInterval;
  coarse_frequency_axis[number_of_aperiodicities + 1] = fs / 2.0;

  double *frequency_axis = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i)
    frequency_axis[i] = static_cast<double>(i) * fs / fft_size;

  for (int i = 0; i < f0_length; ++i) {
    if (f0[i] == 0 || aperiodicity0[i] <= option->threshold) continue;
    D4CGeneralBody(x, x_length, fs, MyMaxDouble(world::kFloorF0D4C, f0[i]),
        fft_size_d4c, temporal_positions[i], number_of_aperiodicities, window,
        window_length, &forward_real_fft, &coarse_aperiodicity[1], &randn_state);

    // Linear interpolation to convert the coarse aperiodicity into its
    // spectral representation.
    GetAperiodicity(coarse_frequency_axis, coarse_aperiodicity,
        number_of_aperiodicities, frequency_axis, fft_size, aperiodicity[i]);
  }

  DestroyForwardRealFFT(&forward_real_fft);
  delete[] aperiodicity0;
  delete[] coarse_frequency_axis;
  delete[] coarse_aperiodicity;
  delete[] window;
  delete[] frequency_axis;
}